

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

TableSet * __thiscall
wasm::Builder::makeTableSet(Builder *this,Name table,Expression *index,Expression *value)

{
  TableSet *pTVar1;
  
  pTVar1 = MixedArena::alloc<wasm::TableSet>(&this->wasm->allocator);
  (pTVar1->table).super_IString.str._M_len = table.super_IString.str._M_len;
  (pTVar1->table).super_IString.str._M_str = table.super_IString.str._M_str;
  pTVar1->index = index;
  pTVar1->value = value;
  wasm::TableSet::finalize();
  return pTVar1;
}

Assistant:

TableSet* makeTableSet(Name table, Expression* index, Expression* value) {
    auto* ret = wasm.allocator.alloc<TableSet>();
    ret->table = table;
    ret->index = index;
    ret->value = value;
    ret->finalize();
    return ret;
  }